

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall Minisat::Clause::Clause(Clause *this,Clause *from,bool use_extra)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  uint uVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  
  aVar1 = from->header;
  this->header = (anon_struct_4_5_613047fb_for_header)
                 (((uint)aVar1 & 0xfffffff7) + (int)CONCAT71(in_register_00000011,use_extra) * 8);
  if (0x1f < (uint)from->header) {
    uVar3 = 0;
    do {
      this[uVar3 + 1].header = from[uVar3 + 1].header;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (uint)from->header >> 5);
  }
  if (use_extra) {
    uVar2 = ((uint)aVar1 >> 5) << 2;
    if (((uint)aVar1 & 4) != 0) {
      *(undefined4 *)(&this[1].header.field_0x0 + uVar2) =
           *(undefined4 *)(&from[1].header.field_0x0 + uVar2);
      return;
    }
    *(undefined4 *)(&this[1].header.field_0x0 + uVar2) =
         *(undefined4 *)(&from[1].header.field_0x0 + uVar2);
  }
  return;
}

Assistant:

Clause(const Clause& from, bool use_extra){
        header           = from.header;
        header.has_extra = use_extra;   // NOTE: the copied clause may lose the extra field.

        for (int i = 0; i < from.size(); i++)
            data[i].lit = from[i];

        if (header.has_extra){
            if (header.learnt)
                data[header.size].act = from.data[header.size].act;
            else 
                data[header.size].abs = from.data[header.size].abs;
    }
    }